

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cipher.cc
# Opt level: O1

int SSL_CIPHER_get_kx_nid(SSL_CIPHER *cipher)

{
  uint uVar1;
  
  uVar1 = cipher->algorithm_mkey - 1;
  if ((uVar1 < 8) && ((0x8bU >> (uVar1 & 0x1f) & 1) != 0)) {
    return *(int *)(&DAT_00230d80 + (ulong)uVar1 * 4);
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_cipher.cc"
                ,0x539,"int SSL_CIPHER_get_kx_nid(const SSL_CIPHER *)");
}

Assistant:

int SSL_CIPHER_get_kx_nid(const SSL_CIPHER *cipher) {
  switch (cipher->algorithm_mkey) {
    case SSL_kRSA:
      return NID_kx_rsa;
    case SSL_kECDHE:
      return NID_kx_ecdhe;
    case SSL_kPSK:
      return NID_kx_psk;
    case SSL_kGENERIC:
      return NID_kx_any;
  }
  assert(0);
  return NID_undef;
}